

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

RISCVCPU * cpu_riscv_init_riscv32(uc_struct_conflict12 *uc)

{
  CPUClass *k;
  CPUClass *cc;
  CPUState_conflict *cs;
  RISCVCPU *cpu;
  uc_struct_conflict12 *uc_local;
  
  uc_local = (uc_struct_conflict12 *)calloc(1,0x9190);
  if ((CPUState *)uc_local == (CPUState *)0x0) {
    uc_local = (uc_struct_conflict12 *)0x0;
  }
  else {
    if (uc->cpu_model == 0x7fffffff) {
      uc->cpu_model = 3;
    }
    if ((uint)uc->cpu_model < 4) {
      k = (CPUClass *)(((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x1bd);
      ((CPUState *)uc_local)->cc = k;
      ((CPUState *)uc_local)->uc = (uc_struct_conflict7 *)uc;
      uc->cpu = (CPUState_conflict *)uc_local;
      cpu_class_init((uc_struct *)uc,k);
      riscv_cpu_class_init(uc,k,(void *)0x0);
      *(undefined1 *)(((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x1b8) = 1;
      *(undefined1 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xdc1) = 0;
      *(undefined1 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xdc2) = 1;
      *(undefined1 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xdc3) = 1;
      *(undefined1 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xdc4) = 1;
      *(undefined1 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xdc5) = 1;
      *(undefined1 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xdc6) = 1;
      *(undefined1 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xdc7) = 1;
      *(undefined1 *)(((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x1b9) = 1;
      *(undefined1 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xdc9) = 1;
      *(undefined1 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xdca) = 0;
      *(undefined1 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xdcb) = 1;
      *(undefined1 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xdcc) = 1;
      *(undefined1 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xdcd) = 1;
      ((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x1ba] = (TranslationBlock *)"v1.11.0";
      *(undefined1 *)(((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x1bc) = 1;
      *(undefined1 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0xde1) = 1;
      cpu_common_initfn((uc_struct *)uc,(CPUState *)uc_local);
      riscv_cpu_init(uc,(CPUState_conflict *)uc_local);
      (*cpu_models[uc->cpu_model].initfn)((CPUState_conflict *)uc_local);
      riscv_cpu_realize(uc,(CPUState_conflict *)uc_local);
      cpu_address_space_init_riscv32
                ((CPUState_conflict *)uc_local,0,
                 (MemoryRegion_conflict *)((CPUState *)uc_local)->memory);
      qemu_init_vcpu_riscv32((CPUState_conflict *)uc_local);
    }
    else {
      free(uc_local);
      uc_local = (uc_struct_conflict12 *)0x0;
    }
  }
  return (RISCVCPU *)uc_local;
}

Assistant:

RISCVCPU *cpu_riscv_init(struct uc_struct *uc)
{
    RISCVCPU *cpu;
    CPUState *cs;
    CPUClass *cc;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

#ifdef TARGET_RISCV32
    if (uc->cpu_model == INT_MAX) {
        uc->cpu_model = UC_CPU_RISCV32_SIFIVE_U34;
    }
#else
    /* TARGET_RISCV64 */
    if (uc->cpu_model == INT_MAX) {
        uc->cpu_model = UC_CPU_RISCV64_SIFIVE_U54;
    }
#endif

    if (uc->cpu_model >= ARRAY_SIZE(cpu_models)) {
        free(cpu);
        return NULL;
    }

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = (CPUState *)cpu;

    /* init CPUClass */
    cpu_class_init(uc, cc);

    /* init RISCVCPUClass */
    riscv_cpu_class_init(uc, cc, NULL);

    /* init device properties*/
    cpu->cfg.ext_i = true;
    cpu->cfg.ext_e = false;
    cpu->cfg.ext_g = true;
    cpu->cfg.ext_m = true;
    cpu->cfg.ext_a = true;
    cpu->cfg.ext_f = true;
    cpu->cfg.ext_d = true;
    cpu->cfg.ext_c = true;
    cpu->cfg.ext_s = true;
    cpu->cfg.ext_u = true;
    cpu->cfg.ext_h = false;
    cpu->cfg.ext_counters = true;
    cpu->cfg.ext_ifencei = true;
    cpu->cfg.ext_icsr = true;
    cpu->cfg.priv_spec = "v1.11.0";
    cpu->cfg.mmu = true;
    cpu->cfg.pmp = true;

    /* init CPUState */
    cpu_common_initfn(uc, cs);

    /* init CPU */
    riscv_cpu_init(uc, cs);

    /* init specific CPU model */
    cpu_models[uc->cpu_model].initfn(cs);

    /* realize CPU */
    riscv_cpu_realize(uc, cs);

    // init addresss space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    return cpu;
}